

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int asn1_get_tagged_int(uchar **p,uchar *end,int tag,int *val)

{
  uchar *puVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  bool bVar5;
  ulong local_20;
  
  iVar2 = mbedtls_asn1_get_tag(p,end,&local_20,tag);
  if (((iVar2 == 0) && (iVar2 = -100, local_20 != 0)) && (puVar1 = *p, -1 < (char)*puVar1)) {
    while( true ) {
      puVar3 = puVar1 + 1;
      if (local_20 == 0) break;
      if (*puVar1 != '\0') {
        if (4 < local_20) {
          return -100;
        }
        if ((local_20 == 4) && ((char)*puVar1 < '\0')) {
          return -100;
        }
        break;
      }
      *p = puVar3;
      local_20 = local_20 - 1;
      puVar1 = puVar3;
    }
    *val = 0;
    iVar2 = 0;
    uVar4 = 0;
    while (bVar5 = local_20 != 0, local_20 = local_20 - 1, bVar5) {
      uVar4 = uVar4 << 8 | (uint)puVar3[-1];
      *val = uVar4;
      *p = puVar3;
      puVar3 = puVar3 + 1;
    }
  }
  return iVar2;
}

Assistant:

static int asn1_get_tagged_int(unsigned char **p,
                               const unsigned char *end,
                               int tag, int *val)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len, tag)) != 0) {
        return ret;
    }

    /*
     * len==0 is malformed (0 must be represented as 020100 for INTEGER,
     * or 0A0100 for ENUMERATED tags
     */
    if (len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    /* This is a cryptography library. Reject negative integers. */
    if ((**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    /* Skip leading zeros. */
    while (len > 0 && **p == 0) {
        ++(*p);
        --len;
    }

    /* Reject integers that don't fit in an int. This code assumes that
     * the int type has no padding bit. */
    if (len > sizeof(int)) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
    if (len == sizeof(int) && (**p & 0x80) != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    *val = 0;
    while (len-- > 0) {
        *val = (*val << 8) | **p;
        (*p)++;
    }

    return 0;
}